

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneBoxOneFuncOnce.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *function;
  int iVar1;
  Box *box;
  Size SVar2;
  void *address;
  code *pcVar3;
  int iVar4;
  
  if (argc < 3) {
    iVar4 = 0;
    printf("usage: %s [path to library] [function name]\n",*argv);
  }
  else {
    function = argv[2];
    box = CreateBox(argv[1],0x4000000);
    iVar1 = getpagesize();
    SVar2 = GetBoxSize(box);
    address = (void *)memalign((long)iVar1,SVar2);
    iVar4 = 0;
    printf("[driver] the box is at %p\n",address);
    iVar1 = DeployBox(box,address);
    if (iVar1 == 0) {
      PreExecute(box);
      pcVar3 = (code *)GetExecutedFunction(box,function);
      (*pcVar3)();
      SystemPause();
      ReleaseBox(box);
      free(address);
    }
    else {
      fwrite("DeployBox: fail\n",0x10,1,_stderr);
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

int main(int argc, const char *argv[])
{
    if (argc < 3)
    {
        printf("usage: %s [path to library] [function name]\n", argv[0]);
        return 0;
    }
    const char *file = argv[1], *function = argv[2];

    // create a box with 64MB heap for library
    Box *libraryBox = CreateBox(file, 64u << 20u);
    // make sure there are sufficient usable memory at the location
    // that the box will be deployed, the memory must be aligned to page
    // the memory region could be acquired in any way, even from stack,
    // from global variable or from OS's shared memory
    // for demostration the memory is simply `malloc`ed
    Address boxLocation = memalign(getpagesize(), GetBoxSize(libraryBox));
    printf("[driver] the box is at %p\n", boxLocation);
    // deploy the box into the location
    if (DeployBox(libraryBox, boxLocation))
    {
        fprintf(stderr, "DeployBox: fail\n");
        return 1;
    }
    // call the function
    // place function arguments in the second pair of bracket if there's any
    RunBox(libraryBox, Runner, function)();

    // pause to let user check process memory layout
    SystemPause();

    ReleaseBox(libraryBox);
    free(boxLocation);
    return 0;
}